

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_create_key_exchange(ptls_key_exchange_context_t **ctx,EVP_PKEY *pkey)

{
  int iVar1;
  int iVar2;
  ec_key_st *key;
  EC_GROUP *group;
  EVP_PKEY *in_RSI;
  ptls_key_exchange_context_t **unaff_retaddr;
  ptls_key_exchange_algorithm_t *algo;
  EC_KEY *eckey;
  int id;
  int ret;
  ptls_key_exchange_algorithm_t *eckey_00;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = EVP_PKEY_get_id(in_RSI);
  if (iVar1 == 0x198) {
    key = EVP_PKEY_get1_EC_KEY(in_RSI);
    group = EC_KEY_get0_group(key);
    iVar2 = EC_GROUP_get_curve_name(group);
    if (iVar2 == 0x19f) {
      eckey_00 = &ptls_openssl_secp256r1;
    }
    else if (iVar2 == 0x2cb) {
      eckey_00 = &ptls_openssl_secp384r1;
    }
    else {
      if (iVar2 != 0x2cc) {
        EC_KEY_free(key);
        return 0x204;
      }
      eckey_00 = &ptls_openssl_secp521r1;
    }
    iVar1 = x9_62_init_key((ptls_key_exchange_algorithm_t *)
                           CONCAT44(in_stack_ffffffffffffffe4,iVar1),
                           (ptls_key_exchange_context_t **)key,(EC_KEY *)eckey_00);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      EC_KEY_free(key);
    }
  }
  else if (iVar1 == 0x40a) {
    iVar1 = evp_keyex_init(algo,unaff_retaddr,
                           (EVP_PKEY *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                          );
    if (iVar1 == 0) {
      EVP_PKEY_up_ref(in_RSI);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 0x204;
  }
  return iVar1;
}

Assistant:

int ptls_openssl_create_key_exchange(ptls_key_exchange_context_t **ctx, EVP_PKEY *pkey)
{
    int ret, id;

    switch (id = EVP_PKEY_id(pkey)) {

    case EVP_PKEY_EC: {
        /* obtain eckey */
        EC_KEY *eckey = EVP_PKEY_get1_EC_KEY(pkey);

        /* determine algo */
        ptls_key_exchange_algorithm_t *algo;
        switch (EC_GROUP_get_curve_name(EC_KEY_get0_group(eckey))) {
        case NID_X9_62_prime256v1:
            algo = &ptls_openssl_secp256r1;
            break;
#if PTLS_OPENSSL_HAVE_SECP384R1
        case NID_secp384r1:
            algo = &ptls_openssl_secp384r1;
            break;
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
        case NID_secp521r1:
            algo = &ptls_openssl_secp521r1;
            break;
#endif
        default:
            EC_KEY_free(eckey);
            return PTLS_ERROR_INCOMPATIBLE_KEY;
        }

        /* load key */
        if ((ret = x9_62_init_key(algo, ctx, eckey)) != 0) {
            EC_KEY_free(eckey);
            return ret;
        }

        return 0;
    } break;

#if PTLS_OPENSSL_HAVE_X25519
    case NID_X25519:
        if ((ret = evp_keyex_init(&ptls_openssl_x25519, ctx, pkey)) != 0)
            return ret;
        EVP_PKEY_up_ref(pkey);
        return 0;
#endif

    default:
        return PTLS_ERROR_INCOMPATIBLE_KEY;
    }
}